

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

ProString * __thiscall
QMakeEvaluator::propertyValue(ProString *__return_storage_ptr__,QMakeEvaluator *this,ProKey *name)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QLatin1String local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QLatin1String::QLatin1String(&local_38,"QMAKE_MKSPECS");
  bVar1 = ProString::operator==(&name->super_ProString,local_38);
  if (bVar1) {
    QListSpecialMethods<QString>::join
              ((QString *)&local_50,(QListSpecialMethods<QString> *)&this->m_mkspecPaths,
               &this->m_option->dirlist_sep);
    ProString::ProString(__return_storage_ptr__,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->m_file = 0xaaaaaaaaaaaaaaaa;
    __return_storage_ptr__->m_hash = 0xaaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_string).d.size = -0x5555555555555556;
    __return_storage_ptr__->m_offset = -0x55555556;
    __return_storage_ptr__->m_length = -0x55555556;
    (__return_storage_ptr__->m_string).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_string).d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QMakeGlobals::propertyValue(__return_storage_ptr__,this->m_option,name);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString QMakeEvaluator::propertyValue(const ProKey &name) const
{
    if (name == QLatin1String("QMAKE_MKSPECS"))
        return ProString(m_mkspecPaths.join(m_option->dirlist_sep));
    ProString ret = m_option->propertyValue(name);
//    if (ret.isNull())
//        evalError(fL1S("Querying unknown property %1").arg(name.toQStringView()));
    return ret;
}